

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

GLenum __thiscall irr::video::COpenGLDriver::getGLBlend(COpenGLDriver *this,E_BLEND_FACTOR factor)

{
  GLenum r;
  E_BLEND_FACTOR factor_local;
  COpenGLDriver *this_local;
  
  r = 0;
  switch(factor) {
  case EBF_ZERO:
    r = 0;
    break;
  case EBF_ONE:
    r = 1;
    break;
  case EBF_DST_COLOR:
    r = 0x306;
    break;
  case EBF_ONE_MINUS_DST_COLOR:
    r = 0x307;
    break;
  case EBF_SRC_COLOR:
    r = 0x300;
    break;
  case EBF_ONE_MINUS_SRC_COLOR:
    r = 0x301;
    break;
  case EBF_SRC_ALPHA:
    r = 0x302;
    break;
  case EBF_ONE_MINUS_SRC_ALPHA:
    r = 0x303;
    break;
  case EBF_DST_ALPHA:
    r = 0x304;
    break;
  case EBF_ONE_MINUS_DST_ALPHA:
    r = 0x305;
    break;
  case EBF_SRC_ALPHA_SATURATE:
    r = 0x308;
  }
  return r;
}

Assistant:

GLenum COpenGLDriver::getGLBlend(E_BLEND_FACTOR factor) const
{
	GLenum r = 0;
	switch (factor) {
	case EBF_ZERO:
		r = GL_ZERO;
		break;
	case EBF_ONE:
		r = GL_ONE;
		break;
	case EBF_DST_COLOR:
		r = GL_DST_COLOR;
		break;
	case EBF_ONE_MINUS_DST_COLOR:
		r = GL_ONE_MINUS_DST_COLOR;
		break;
	case EBF_SRC_COLOR:
		r = GL_SRC_COLOR;
		break;
	case EBF_ONE_MINUS_SRC_COLOR:
		r = GL_ONE_MINUS_SRC_COLOR;
		break;
	case EBF_SRC_ALPHA:
		r = GL_SRC_ALPHA;
		break;
	case EBF_ONE_MINUS_SRC_ALPHA:
		r = GL_ONE_MINUS_SRC_ALPHA;
		break;
	case EBF_DST_ALPHA:
		r = GL_DST_ALPHA;
		break;
	case EBF_ONE_MINUS_DST_ALPHA:
		r = GL_ONE_MINUS_DST_ALPHA;
		break;
	case EBF_SRC_ALPHA_SATURATE:
		r = GL_SRC_ALPHA_SATURATE;
		break;
	}
	return r;
}